

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

void D_DoomLoop(void)

{
  AActor *listenactor;
  CRecoverableError *error;
  CVMAbortException *error_1;
  int local_c;
  int lasttic;
  
  local_c = 0;
  r_NoInterpolate = true;
  Advisory = (FTexture *)0x0;
  Page = (FTexture *)0x0;
  FBaseCVar::Callback(&vid_cursor.super_FBaseCVar);
  do {
    if (local_c < gametic) {
      local_c = gametic;
      I_StartFrame();
    }
    if ((singletics & 1U) == 0) {
      TryRunTics();
    }
    else {
      I_StartTic();
      D_ProcessEvents();
      G_BuildTiccmd(netcmds[consoleplayer] + maketic % 0x24);
      if ((advancedemo & 1U) != 0) {
        D_DoAdvanceDemo();
      }
      C_Ticker();
      M_Ticker();
      G_Ticker();
      listenactor = TObjPtr::operator_cast_to_AActor_
                              ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      S_UpdateSounds(listenactor);
      gametic = gametic + 1;
      maketic = maketic + 1;
      GC::CheckGC();
      Net_NewMakeTic();
    }
    I_StartTic();
    D_Display();
  } while ((wantToRestart & 1U) == 0);
  wantToRestart = false;
  return;
}

Assistant:

void D_DoomLoop ()
{
	int lasttic = 0;

	// Clamp the timer to TICRATE until the playloop has been entered.
	r_NoInterpolate = true;
	Page = Advisory = NULL;

	vid_cursor.Callback();

	for (;;)
	{
		try
		{
			// frame syncronous IO operations
			if (gametic > lasttic)
			{
				lasttic = gametic;
				I_StartFrame ();
			}
			
			// process one or more tics
			if (singletics)
			{
				I_StartTic ();
				D_ProcessEvents ();
				G_BuildTiccmd (&netcmds[consoleplayer][maketic%BACKUPTICS]);
				if (advancedemo)
					D_DoAdvanceDemo ();
				C_Ticker ();
				M_Ticker ();
				G_Ticker ();
				// [RH] Use the consoleplayer's camera to update sounds
				S_UpdateSounds (players[consoleplayer].camera);	// move positional sounds
				gametic++;
				maketic++;
				GC::CheckGC ();
				Net_NewMakeTic ();
			}
			else
			{
				TryRunTics (); // will run at least one tic
			}
			// Update display, next frame, with current state.
			I_StartTic ();
			D_Display ();
			if (wantToRestart)
			{
				wantToRestart = false;
				return;
			}
		}
		catch (CRecoverableError &error)
		{
			if (error.GetMessage ())
			{
				Printf (PRINT_BOLD, "\n%s\n", error.GetMessage());
			}
			D_ErrorCleanup ();
		}
		catch (CVMAbortException &error)
		{
			error.MaybePrintMessage();
			Printf("%s", error.stacktrace.GetChars());
			D_ErrorCleanup();
		}
	}
}